

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mctools_path_join(mcu8str *__return_storage_ptr__,mcu8str *p1raw,mcu8str *p2raw)

{
  ulong uVar1;
  char *__dest;
  ulong uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  mcu8str_size_t prealloc_size;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *__src;
  mcu8str p2;
  mcu8str p1;
  mcu8str local_60;
  mcu8str local_48;
  
  pcVar10 = p1raw->c_str;
  uVar8 = p1raw->size;
  local_48.buflen = uVar8 + 1;
  local_48.owns_memory = 0;
  local_48.c_str = pcVar10;
  local_48.size = uVar8;
  iVar5 = mctools_impl_has_winnamespace(p1raw);
  if (iVar5 != 0) {
    pcVar10 = pcVar10 + 4;
    uVar8 = uVar8 - 4;
    local_48.c_str = pcVar10;
    local_48.size = uVar8;
  }
  __src = p2raw->c_str;
  uVar9 = p2raw->size;
  local_60.buflen = uVar9 + 1;
  local_60.owns_memory = 0;
  local_60.c_str = __src;
  local_60.size = uVar9;
  iVar5 = mctools_impl_has_winnamespace(p2raw);
  if (iVar5 != 0) {
    __src = __src + 4;
    uVar9 = uVar9 - 4;
    local_60.c_str = __src;
    local_60.size = uVar9;
  }
  if (uVar9 == 0) {
    if (uVar8 != 0) {
      if ((pcVar10[uVar8 - 1] == '\\') || (pcVar10[uVar8 - 1] == '/')) {
        mcu8str_copy(__return_storage_ptr__,&local_48);
      }
      else {
        mcu8str_create(__return_storage_ptr__,(ulong)(uVar8 + 1));
        mcu8str_append(__return_storage_ptr__,&local_48);
        pcVar10 = __return_storage_ptr__->c_str;
        uVar8 = __return_storage_ptr__->size;
        pcVar10[uVar8] = '/';
        uVar8 = uVar8 + 1;
        __return_storage_ptr__->size = uVar8;
        pcVar10[uVar8] = '\0';
      }
      mctools_pathseps_platform(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->buflen = 0;
    __return_storage_ptr__->owns_memory = 0;
    return __return_storage_ptr__;
  }
  if (uVar8 < 2) {
    cVar3 = '\0';
  }
  else {
    cVar3 = mctools_drive_letter(&local_48);
  }
  if (uVar9 == 1) {
    cVar4 = '\0';
  }
  else {
    cVar4 = mctools_drive_letter(&local_60);
  }
  if ((uVar8 == 0) || (iVar5 = mctools_path_is_absolute(&local_60), iVar5 != 0)) {
    if (cVar4 != '\0' || cVar3 == '\0') goto LAB_00103249;
    mcu8str_create(__return_storage_ptr__,(ulong)(uVar9 + 2));
    pcVar10 = __return_storage_ptr__->c_str;
    *pcVar10 = cVar3;
    pcVar10[1] = ':';
    pcVar10[2] = '\0';
    __return_storage_ptr__->size = 2;
    mcu8str_append(__return_storage_ptr__,&local_60);
  }
  else {
    if (cVar3 != cVar4 && cVar4 != '\0') {
LAB_00103249:
      mcu8str_copy(__return_storage_ptr__,&local_60);
      mctools_pathseps_platform(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    uVar6 = (ulong)uVar8;
    uVar1 = (ulong)(cVar3 != '\0') * 2 + 1;
    uVar2 = uVar6;
    lVar7 = 0;
    if (cVar3 != '\0') {
      lVar7 = (ulong)(cVar3 != cVar4) * 2 + -2;
    }
    for (; ((uVar1 < uVar2 &&
            ((uVar6 = uVar2, pcVar10[uVar2 - 1] == '\\' || (pcVar10[uVar2 - 1] == '/')))) &&
           ((pcVar10[uVar2 - 2] == '\\' || (pcVar10[uVar2 - 2] == '/')))); uVar2 = uVar2 - 1) {
      uVar6 = uVar1;
    }
    cVar3 = pcVar10[uVar6 - 1];
    prealloc_size = (cVar3 != '/' && cVar3 != '\\') + uVar6 + lVar7 + (ulong)uVar9;
    mcu8str_create(__return_storage_ptr__,prealloc_size);
    __dest = __return_storage_ptr__->c_str;
    memcpy(__dest,pcVar10,uVar6);
    if ((cVar3 != '/') && (cVar3 != '\\')) {
      __dest[uVar6] = '/';
      uVar6 = uVar6 + 1;
    }
    memcpy(__dest + uVar6,__src,lVar7 + (ulong)uVar9 + 1);
    __return_storage_ptr__->size = (uint)prealloc_size;
  }
  mctools_pathseps_platform(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_path_join( const mcu8str* p1raw, const mcu8str* p2raw )
  {
    //In general try to mimic os.path.path from Python, although we do not
    //require a drive letter on windows to be considered an absolute path, so we
    //might have slight changes in some weird cases.

    mcu8str p1 = mctools_impl_view_no_winnamespace(p1raw);
    mcu8str p2 = mctools_impl_view_no_winnamespace(p2raw);

#ifdef MC_IS_WINDOWS
    const char native_sep = '\\';
#else
    const char native_sep = '/';
#endif

    if ( p2.size == 0 ) {
      //Simply copy p1, but ensure it ends in a separator:
      if ( !p1.size )
        return mcu8str_create_empty();//special case: join("","")->""
      char lastchar = p1.c_str[p1.size-1];
      if ( lastchar == '\\' || lastchar == '/' ) {
        mcu8str p1copy = mcu8str_copy( &p1 );
        mctools_pathseps_platform(&p1copy);
        return p1copy;
      }
      mcu8str res = mcu8str_create( p1.size + 1 );
      mcu8str_append( &res, &p1 );
      res.c_str[res.size] = native_sep;
      ++( res.size );
      res.c_str[res.size] = '\0';
      mctools_pathseps_platform(&res);
      return res;
    }

    char drive_letter1 = p1.size >= 2 ? mctools_drive_letter(&p1) : 0;
    char drive_letter2 = p2.size >= 2 ? mctools_drive_letter(&p2) : 0;
    if ( p1.size == 0 || mctools_path_is_absolute(&p2) ) {
      //p1 is empty or p2 is an absolute path, so simply discard p1 (like
      //Pythons os.path.join does in this case). However, if there is a drive
      //letter in p1 and not in p2, we use that drive letter:
      if ( drive_letter1 && !drive_letter2 ) {
        mcu8str res = mcu8str_create( p2.size + 2 );
        res.c_str[0] = drive_letter1;
        res.c_str[1] = ':';
        res.c_str[2] = '\0';
        res.size = 2;
        mcu8str_append( &res, &p2 );
        mctools_pathseps_platform(&res);
        return res;
      } else {
        mcu8str p2copy = mcu8str_copy( &p2 );
        mctools_pathseps_platform(&p2copy);
        return p2copy;
      }
    }

    if ( drive_letter2 && drive_letter1 != drive_letter2 ) {
      //p2 has a drive letter and p1 has a different drive letter => simply
      //return p2.
      mcu8str p2copy = mcu8str_copy( &p2 );
      mctools_pathseps_platform(&p2copy);
      return p2copy;
    }

    //Neither p1 or p2 are empty here, so we can simply join them. However, if
    //there is a common drive letter or repeated slashes at the end of p1, we do
    //not repeat them needlessley.

    //Selected ranges:
    mcu8str_size_t iB1 = 0;
    mcu8str_size_t iE1 = p1.size;
    mcu8str_size_t iB2 = 0;
    mcu8str_size_t iE2 = p2.size;

    if ( drive_letter1 && drive_letter1 == drive_letter2 )
      iB2 += 2;//skip common drive letter from p2

    //Strip repeated trailing slashes down to one trailing slash:
    mcu8str_size_t minlen1 = ( drive_letter1 ? 3 : 1 );
    while ( iE1-iB1 > minlen1
            && ( p1.c_str[iE1-1]=='/' || p1.c_str[iE1-1]=='\\' )
            && ( p1.c_str[iE1-2]=='/' || p1.c_str[iE1-2]=='\\' ) )
      --iE1;

    mcu8str_size_t needs_slash = ( ( p1.c_str[iE1-1]=='/'
                                   || p1.c_str[iE1-1]=='\\' ) ? 0 : 1 );

    mcu8str_size_t s1 = iE1-iB1;
    mcu8str_size_t s2 = iE2-iB2;
    mcu8str_size_t newsize = s1 + s2 + needs_slash;
    mcu8str res =  mcu8str_create( newsize  );
    STDNS memcpy( res.c_str, p1.c_str, s1 );
    mcu8str_size_t used = s1;
    if ( needs_slash ) {
      res.c_str[used] = native_sep;
      ++used;
    }
    STDNS memcpy( res.c_str + used, p2.c_str, s2+1 );//+1 to include null char
    res.size = (unsigned)newsize;//cast ok due to mcu8str_create
    mctools_pathseps_platform(&res);
    return res;
  }